

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx512.cpp
# Opt level: O2

void ncnn::crop_pack4_sse(Mat *src,Mat *dst,int top,int left)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  
  iVar1 = dst->w;
  iVar2 = src->w;
  puVar5 = (undefined8 *)
           ((long)src->data + (long)(left << 2) * 4 + (long)top * (long)iVar2 * src->elemsize);
  puVar6 = (undefined8 *)dst->data;
  iVar7 = 0;
  iVar4 = iVar1;
  if (iVar1 < 1) {
    iVar4 = 0;
  }
  iVar8 = dst->h;
  if (dst->h < 1) {
    iVar8 = 0;
  }
  for (; iVar9 = iVar4, iVar7 != iVar8; iVar7 = iVar7 + 1) {
    while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
      uVar3 = puVar5[1];
      *puVar6 = *puVar5;
      puVar6[1] = uVar3;
      puVar5 = puVar5 + 2;
      puVar6 = puVar6 + 2;
    }
    puVar5 = (undefined8 *)((long)puVar5 + (long)((iVar2 - iVar1) * 4) * 4);
  }
  return;
}

Assistant:

static void crop_pack4_sse(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;
    int right = src.w - dst.w - left;

    const float* ptr = src.row(top) + left * 4;
    float* outptr = dst;

    for (int y = 0; y < h; y++)
    {
        for (int x = 0; x < w; x++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(outptr, _p);
            ptr += 4;
            outptr += 4;
        }

        ptr += (left + right) * 4;
    }
}